

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O0

void CreateBackwardReferencesNH6
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  byte bVar1;
  ushort uVar2;
  undefined4 uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  char *in_RCX;
  long in_RDX;
  ulong *puVar13;
  ulong in_RSI;
  ulong in_RDI;
  long in_R8;
  long in_R9;
  bool bVar14;
  long in_stack_00000008;
  int *in_stack_00000010;
  ulong *in_stack_00000018;
  int *in_stack_00000020;
  long *in_stack_00000028;
  long *in_stack_00000030;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  int delayed_backward_references_in_row;
  uint8_t p2;
  uint8_t p1;
  int dict_id;
  HasherSearchResult sr;
  size_t dictionary_start;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command *orig_commands;
  size_t position_offset;
  size_t max_backward_limit;
  H6 *privat;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  uint32_t delta;
  size_t nbits;
  size_t offset_2;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket_2;
  size_t dist;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  uint32_t nbits_2;
  uint32_t offset_3;
  uint16_t bits64;
  int next_last_distance_1;
  int last_distance_1;
  int next_last_distance;
  int last_distance;
  size_t score_4;
  size_t len_3;
  size_t backward_4;
  uint32_t current4_1;
  size_t prev_ix_3;
  size_t max_length_m4_1;
  uint32_t first4_1;
  size_t down_1;
  uint32_t *bucket_1;
  size_t key_2;
  size_t score_3;
  size_t len_2;
  size_t prev_ix_2;
  size_t backward_3;
  size_t i_2;
  size_t best_len_1;
  size_t best_score_1;
  size_t min_score_1;
  size_t cur_ix_masked_1;
  uint32_t *buckets_1;
  uint16_t *num_1;
  size_t matching_bits_4;
  uint64_t x_4;
  uint8_t *s1_orig_4;
  size_t matching_bits_3;
  uint64_t x_3;
  uint8_t *s1_orig_3;
  int item_matches_1;
  size_t i_3;
  size_t key_3;
  uint64_t t_11;
  uint64_t t_10;
  uint64_t t_16;
  uint64_t t_15;
  uint32_t t_14;
  uint32_t t_13;
  uint32_t h_3;
  uint32_t t_17;
  size_t transform_id_1;
  size_t cut_1;
  size_t score_5;
  size_t backward_5;
  size_t matchlen_1;
  size_t offset_1;
  size_t matching_bits_5;
  uint64_t x_5;
  uint8_t *s1_orig_5;
  uint64_t t_19;
  uint64_t t_18;
  size_t score_1;
  size_t len_1;
  size_t backward_1;
  uint32_t current4;
  size_t prev_ix_1;
  size_t max_length_m4;
  uint32_t first4;
  size_t down;
  uint32_t *bucket;
  size_t key;
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t backward;
  size_t i;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  size_t cur_ix_masked;
  uint32_t *buckets;
  uint16_t *num;
  size_t matching_bits_1;
  uint64_t x_1;
  uint8_t *s1_orig_1;
  size_t matching_bits;
  uint64_t x;
  uint8_t *s1_orig;
  int item_matches;
  size_t i_1;
  size_t key_1;
  uint64_t t_1;
  uint64_t t;
  uint64_t t_6;
  uint64_t t_5;
  uint32_t t_4;
  uint32_t t_3;
  uint32_t h_1;
  uint32_t t_7;
  size_t transform_id;
  size_t cut;
  size_t score_2;
  size_t backward_2;
  size_t matchlen;
  size_t offset;
  size_t matching_bits_2;
  uint64_t x_2;
  uint8_t *s1_orig_2;
  uint64_t t_9;
  uint64_t t_8;
  size_t i_4;
  size_t offset_4;
  size_t minor_ix;
  size_t key_4;
  uint32_t *buckets_2;
  uint16_t *num_2;
  size_t offset_6;
  size_t minor_ix_2;
  size_t key_6;
  uint32_t *buckets_4;
  uint16_t *num_4;
  size_t offset_5;
  size_t minor_ix_1;
  size_t key_5;
  uint32_t *buckets_3;
  uint16_t *num_3;
  uint64_t h_5;
  uint64_t t_21;
  uint64_t h_6;
  uint64_t t_22;
  uint64_t h_4;
  uint64_t t_20;
  uint64_t h;
  uint64_t t_2;
  uint64_t h_2;
  uint64_t t_12;
  ulong local_d10;
  ulong local_d00;
  ulong local_cf0;
  ulong local_ce8;
  ulong local_cd8;
  ulong local_cc0;
  ulong local_cb0;
  ulong local_ca0;
  ulong local_c98;
  char *local_c90;
  char *local_c88;
  ulong local_c78;
  ulong local_c60;
  ulong local_c58;
  ulong local_c50;
  ulong local_c20;
  ulong local_c10;
  ulong local_c08;
  ulong local_c00;
  uint local_bf8;
  int local_be4;
  byte local_bdd;
  uint local_bdc;
  ulong local_bd8;
  ulong local_bd0;
  ulong local_bc8;
  ulong local_bc0;
  char *local_ba8;
  long local_b98;
  ulong local_b90;
  long local_b88;
  ulong local_b80;
  ulong local_b78;
  ulong local_b70;
  int *local_b68;
  long local_b60;
  ulong local_b58;
  long local_b50;
  long local_b48;
  long local_b40;
  char *local_b38;
  long local_b30;
  ulong local_b28;
  ulong local_a40;
  ushort local_92a;
  ushort local_902;
  ushort local_8da;
  ulong local_878;
  char *local_860;
  int local_854;
  ulong local_850;
  long local_848;
  ulong local_840;
  ulong local_838;
  ulong local_820;
  ulong local_818;
  char *local_810;
  ulong local_808;
  ulong local_800;
  ulong local_7f8;
  long local_7f0;
  long local_7e8;
  ulong *local_7e0;
  ulong local_7d8;
  long local_7d0;
  ulong local_7c8;
  char *local_7c0;
  ulong local_7b8;
  int *local_7b0;
  char *local_7a8;
  long local_7a0;
  long *local_798;
  long local_790;
  char *local_770;
  ulong *local_768;
  ulong *local_760;
  char *local_758;
  char *local_738;
  ulong *local_730;
  ulong *local_728;
  char *local_720;
  ulong local_6f0;
  ulong local_6e8;
  int local_6dc;
  ulong *local_6d8;
  ulong local_6d0;
  long local_6c8;
  char *local_6c0;
  ulong *local_6b8;
  long local_6b0;
  long *local_6a8;
  ulong local_608;
  ulong local_600;
  int local_5f8;
  ulong *local_5e8;
  char *local_5b8;
  char *local_588;
  ulong *local_580;
  ulong *local_578;
  char *local_570;
  ulong local_520;
  char *local_508;
  int local_4fc;
  ulong local_4f8;
  long local_4f0;
  ulong local_4e8;
  ulong local_4e0;
  ulong local_4c8;
  ulong local_4c0;
  char *local_4b8;
  ulong local_4b0;
  ulong local_4a8;
  ulong local_4a0;
  long local_498;
  long local_490;
  ulong *local_488;
  ulong local_480;
  long local_478;
  ulong local_470;
  char *local_468;
  ulong local_460;
  int *local_458;
  char *local_450;
  long local_448;
  long *local_440;
  long local_438;
  char *local_418;
  ulong *local_410;
  ulong *local_408;
  char *local_400;
  char *local_3e0;
  ulong *local_3d8;
  ulong *local_3d0;
  char *local_3c8;
  ulong local_398;
  ulong local_390;
  int local_384;
  ulong *local_380;
  ulong local_378;
  long local_370;
  char *local_368;
  ulong *local_360;
  long local_358;
  long *local_350;
  ulong local_2b0;
  ulong local_2a8;
  int local_2a0;
  ulong *local_290;
  char *local_260;
  char *local_230;
  ulong *local_228;
  ulong *local_220;
  char *local_218;
  ulong local_1d8;
  
  local_b50 = in_stack_00000008 + 0x50;
  local_b58 = (1L << ((byte)*(undefined4 *)(in_R9 + 8) & 0x3f)) - 0x10;
  local_b60 = *(long *)(in_R9 + 0x10);
  local_b68 = in_stack_00000020;
  local_b70 = *in_stack_00000018;
  local_b78 = in_RSI + in_RDI;
  local_c50 = in_RSI;
  if (7 < in_RDI) {
    local_c50 = (in_RSI + in_RDI) - 7;
  }
  local_b80 = local_c50;
  iVar7 = 0x200;
  if (*(int *)(in_R9 + 4) < 9) {
    iVar7 = 0x40;
  }
  local_b88 = (long)iVar7;
  local_b90 = in_RSI + local_b88;
  local_b98 = *(long *)(in_R9 + 0x60);
  iVar7 = *(int *)(in_stack_00000008 + 0x70);
  local_b48 = in_R9;
  local_b40 = in_R8;
  local_b38 = in_RCX;
  local_b30 = in_RDX;
  uVar8 = in_RSI;
  if (4 < iVar7) {
    iVar6 = *in_stack_00000010;
    in_stack_00000010[4] = iVar6 + -1;
    in_stack_00000010[5] = iVar6 + 1;
    in_stack_00000010[6] = iVar6 + -2;
    in_stack_00000010[7] = iVar6 + 2;
    in_stack_00000010[8] = iVar6 + -3;
    in_stack_00000010[9] = iVar6 + 3;
    uVar8 = in_RSI;
    if (10 < iVar7) {
      iVar7 = in_stack_00000010[1];
      in_stack_00000010[10] = iVar7 + -1;
      in_stack_00000010[0xb] = iVar7 + 1;
      in_stack_00000010[0xc] = iVar7 + -2;
      in_stack_00000010[0xd] = iVar7 + 2;
      in_stack_00000010[0xe] = iVar7 + -3;
      in_stack_00000010[0xf] = iVar7 + 3;
      uVar8 = in_RSI;
    }
  }
LAB_0238839e:
  do {
    local_b28 = uVar8;
    if (local_b78 <= local_b28 + 8) {
      *in_stack_00000018 = (local_b78 - local_b28) + local_b70;
      *in_stack_00000028 = ((long)in_stack_00000020 - (long)local_b68 >> 4) + *in_stack_00000028;
      return;
    }
    local_ba8 = (char *)(local_b78 - local_b28);
    if (local_b28 < local_b58) {
      local_c58 = local_b28;
    }
    else {
      local_c58 = local_b58;
    }
    local_c60 = local_b28 + local_b60;
    if (local_b58 <= local_c60) {
      local_c60 = local_b58;
    }
    local_bdc = 0;
    local_bdd = 0;
    if (*(int *)(local_b48 + 0x270) != 0) {
      if (local_b28 == 0) {
        local_bdd = 0;
      }
      else {
        local_bdd = *(byte *)(local_b30 + (local_b28 - 1 & (ulong)local_b38));
      }
      if (local_b28 < 2) {
        bVar1 = 0;
      }
      else {
        bVar1 = *(byte *)(local_b30 + (local_b28 - 2 & (ulong)local_b38));
      }
      local_bdc = (uint)*(byte *)(local_b48 + 0x275 +
                                 (long)(int)(uint)(*(byte *)(local_b40 + (ulong)local_bdd) |
                                                  *(byte *)(local_b40 + 0x100 + (ulong)bVar1)));
    }
    local_bc0 = 0;
    local_bd0 = 0;
    local_bc8 = 0x7e4;
    local_440 = *(long **)(local_b48 + 0x2b8 + (long)(int)local_bdc * 8);
    local_478 = local_c60 + local_b98;
    local_480 = *(ulong *)(local_b48 + 0x48);
    local_438 = local_b50;
    local_448 = local_b30;
    local_450 = local_b38;
    local_458 = in_stack_00000010;
    local_460 = local_b28;
    local_470 = local_c58;
    local_488 = &local_bd8;
    local_490 = *(long *)(local_b50 + 0x30);
    local_498 = *(long *)(local_b50 + 0x38);
    local_4a0 = local_b28 & (ulong)local_b38;
    local_4a8 = 0x7e4;
    local_4b0 = 0x7e4;
    local_4b8 = (char *)0x0;
    local_bd8 = 0;
    local_bc0._0_4_ = 0;
    local_468 = local_ba8;
    for (local_4c0 = 0; local_4c0 < (ulong)(long)*(int *)(local_438 + 0x20);
        local_4c0 = local_4c0 + 1) {
      local_4c8 = (ulong)local_458[local_4c0];
      if ((((local_460 - local_4c8 < local_460) && (local_4c8 <= local_470)) &&
          (uVar8 = (ulong)local_450 & local_460 - local_4c8, local_4b8 + local_4a0 <= local_450)) &&
         ((local_4b8 + uVar8 <= local_450 &&
          (local_4b8[local_448 + local_4a0] == local_4b8[local_448 + uVar8])))) {
        puVar13 = (ulong *)(local_448 + uVar8);
        local_3d8 = (ulong *)(local_448 + local_4a0);
        local_3e0 = local_468;
        local_3d0 = puVar13;
LAB_0238888a:
        if (local_3e0 < (char *)0x8) {
          while( true ) {
            bVar14 = false;
            if (local_3e0 != (char *)0x0) {
              bVar14 = (char)*local_3d0 == (char)*local_3d8;
            }
            if (!bVar14) break;
            local_3e0 = local_3e0 + -1;
            local_3d8 = (ulong *)((long)local_3d8 + 1);
            local_3d0 = (ulong *)((long)local_3d0 + 1);
          }
          local_3c8 = (char *)((long)local_3d0 - (long)puVar13);
        }
        else {
          uVar8 = *local_3d8 ^ *local_3d0;
          local_3d8 = local_3d8 + 1;
          if (uVar8 == 0) goto LAB_0238895c;
          iVar7 = 0;
          for (; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
            iVar7 = iVar7 + 1;
          }
          local_3c8 = (char *)((long)local_3d0 + (((ulong)(long)iVar7 >> 3) - (long)puVar13));
        }
        if ((((char *)0x2 < local_3c8) || ((local_3c8 == (char *)0x2 && (local_4c0 < 2)))) &&
           (local_4e0 = (long)local_3c8 * 0x87 + 0x78f, local_4b0 < local_4e0)) {
          if (local_4c0 != 0) {
            local_4e0 = local_4e0 - ((long)(int)(0x1ca10 >> ((byte)local_4c0 & 0xe) & 0xe) + 0x27);
          }
          if (local_4b0 < local_4e0) {
            local_4b0 = local_4e0;
            local_4b8 = local_3c8;
            *local_488 = (ulong)local_3c8;
            local_488[1] = local_4c8;
            local_488[2] = local_4b0;
          }
        }
      }
    }
    local_4e8 = (ulong)(*(long *)(local_448 + local_4a0) * *(long *)(local_438 + 0x10)) >> 0x31;
    local_4f0 = local_498 + (local_4e8 << ((byte)*(undefined4 *)(local_438 + 0x1c) & 0x3f)) * 4;
    if (*(ulong *)(local_438 + 8) < (ulong)*(ushort *)(local_490 + local_4e8 * 2)) {
      local_c78 = (ulong)*(ushort *)(local_490 + local_4e8 * 2) - *(long *)(local_438 + 8);
    }
    else {
      local_c78 = 0;
    }
    local_4f8 = local_c78;
    local_4fc = *(int *)(local_448 + local_4a0);
    local_508 = local_468 + -4;
    local_4c0 = (ulong)*(ushort *)(local_490 + local_4e8 * 2);
    while (local_4f8 < local_4c0) {
      local_4c0 = local_4c0 - 1;
      uVar8 = (ulong)*(uint *)(local_4f0 + (local_4c0 & *(uint *)(local_438 + 0x18)) * 4);
      local_520 = local_460 - uVar8;
      if (local_470 < local_520) break;
      uVar8 = (ulong)local_450 & uVar8;
      if ((((local_4b8 + local_4a0 <= local_450) && (local_4b8 + uVar8 <= local_450)) &&
          (local_4b8[local_448 + local_4a0] == local_4b8[local_448 + uVar8])) &&
         (local_4fc == *(int *)(local_448 + uVar8))) {
        puVar13 = (ulong *)(local_448 + uVar8 + 4);
        local_410 = (ulong *)(local_448 + local_4a0 + 4);
        local_418 = local_508;
        local_408 = puVar13;
LAB_02388e97:
        if (local_418 < (char *)0x8) {
          while( true ) {
            bVar14 = false;
            if (local_418 != (char *)0x0) {
              bVar14 = (char)*local_408 == (char)*local_410;
            }
            if (!bVar14) break;
            local_418 = local_418 + -1;
            local_410 = (ulong *)((long)local_410 + 1);
            local_408 = (ulong *)((long)local_408 + 1);
          }
          local_400 = (char *)((long)local_408 - (long)puVar13);
        }
        else {
          uVar8 = *local_410 ^ *local_408;
          local_410 = local_410 + 1;
          if (uVar8 == 0) goto LAB_02388f69;
          iVar7 = 0;
          for (; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
            iVar7 = iVar7 + 1;
          }
          local_400 = (char *)((long)local_408 + (((ulong)(long)iVar7 >> 3) - (long)puVar13));
        }
        local_400 = local_400 + 4;
        iVar7 = 0x1f;
        if ((uint)local_520 != 0) {
          for (; (uint)local_520 >> iVar7 == 0; iVar7 = iVar7 + -1) {
          }
        }
        uVar8 = ((long)local_400 * 0x87 + 0x780) - (ulong)(uint)(iVar7 * 0x1e);
        if (local_4b0 < uVar8) {
          local_4b8 = local_400;
          local_4b0 = uVar8;
          *local_488 = (ulong)local_400;
          local_488[1] = local_520;
          local_488[2] = local_4b0;
        }
      }
    }
    *(int *)(local_4f0 +
            (ulong)((uint)*(ushort *)(local_490 + local_4e8 * 2) & *(uint *)(local_438 + 0x18)) * 4)
         = (int)local_460;
    *(short *)(local_490 + local_4e8 * 2) = *(short *)(local_490 + local_4e8 * 2) + 1;
    if (local_4a8 == local_488[2]) {
      local_358 = *(long *)(local_438 + 0x28);
      local_360 = (ulong *)(local_448 + local_4a0);
      local_350 = local_440;
      local_368 = local_468;
      local_370 = local_478;
      local_378 = local_480;
      local_380 = local_488;
      local_384 = 0;
      if (*(ulong *)(local_358 + 0x28) >> 7 <= *(ulong *)(local_358 + 0x30)) {
        local_390 = (ulong)(((uint)((int)*local_360 * 0x1e35a7bd) >> 0x12) << 1);
        local_398 = 0;
        while( true ) {
          uVar12 = 2;
          if (local_384 != 0) {
            uVar12 = 1;
          }
          if (uVar12 <= local_398) break;
          *(long *)(local_358 + 0x28) = *(long *)(local_358 + 0x28) + 1;
          if (*(char *)(local_350[4] + local_390) != '\0') {
            local_260 = (char *)(ulong)*(byte *)(local_350[4] + local_390);
            uVar8 = (ulong)*(ushort *)(local_350[3] + local_390 * 2);
            local_290 = local_380;
            if (local_368 < local_260) {
              bVar14 = false;
            }
            else {
              local_228 = (ulong *)(*(long *)(*local_350 + 0xa8) +
                                   (ulong)*(uint *)(*local_350 + 0x20 + (long)local_260 * 4) +
                                   (long)local_260 * uVar8);
              local_220 = local_360;
              local_230 = local_260;
LAB_0238943e:
              if (local_230 < (char *)0x8) {
                while( true ) {
                  bVar14 = false;
                  if (local_230 != (char *)0x0) {
                    bVar14 = (char)*local_220 == (char)*local_228;
                  }
                  if (!bVar14) break;
                  local_230 = local_230 + -1;
                  local_228 = (ulong *)((long)local_228 + 1);
                  local_220 = (ulong *)((long)local_220 + 1);
                }
                local_218 = (char *)((long)local_220 - (long)local_360);
              }
              else {
                uVar9 = *local_228 ^ *local_220;
                local_228 = local_228 + 1;
                if (uVar9 == 0) goto LAB_02389510;
                iVar7 = 0;
                for (; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
                  iVar7 = iVar7 + 1;
                }
                local_218 = (char *)((long)local_220 + (((ulong)(long)iVar7 >> 3) - (long)local_360)
                                    );
              }
              local_2a0 = (int)local_218;
              if ((local_260 < local_218 + *(uint *)((long)local_350 + 0xc)) &&
                 (local_218 != (char *)0x0)) {
                local_2a8 = local_370 + 1 + uVar8 +
                            (((long)local_260 - (long)local_218) * 4 +
                             ((ulong)local_350[2] >>
                              ((char)((long)local_260 - (long)local_218) * '\x06' & 0x3fU) & 0x3f)
                            << (local_260[*local_350] & 0x3fU));
                if (local_378 < local_2a8) {
                  bVar14 = false;
                }
                else {
                  iVar7 = 0x1f;
                  if ((uint)local_2a8 != 0) {
                    for (; (uint)local_2a8 >> iVar7 == 0; iVar7 = iVar7 + -1) {
                    }
                  }
                  local_2b0 = ((long)local_218 * 0x87 + 0x780) - (ulong)(uint)(iVar7 * 0x1e);
                  if (local_2b0 < local_380[2]) {
                    bVar14 = false;
                  }
                  else {
                    *local_380 = (ulong)local_218;
                    *(int *)(local_290 + 3) = (int)local_260 - local_2a0;
                    local_290[1] = local_2a8;
                    local_290[2] = local_2b0;
                    bVar14 = true;
                  }
                }
              }
              else {
                bVar14 = false;
              }
            }
            if (bVar14) {
              *(long *)(local_358 + 0x30) = *(long *)(local_358 + 0x30) + 1;
            }
          }
          local_398 = local_398 + 1;
          local_390 = local_390 + 1;
        }
      }
    }
    if (0x7e4 < local_bc8) {
      local_be4 = 0;
      do {
        local_ba8 = local_ba8 + -1;
        if (*(int *)(local_b48 + 4) < 5) {
          local_c88 = (char *)(local_bd8 - 1);
          if (local_ba8 <= local_c88) {
            local_c88 = local_ba8;
          }
          local_c90 = local_c88;
        }
        else {
          local_c90 = (char *)0x0;
        }
        local_c08 = 0;
        local_c00 = 0x7e4;
        local_c98 = local_b28 + 1;
        if (local_b58 <= local_c98) {
          local_c98 = local_b58;
        }
        local_ca0 = local_b28 + 1 + local_b60;
        if (local_b58 <= local_ca0) {
          local_ca0 = local_b58;
        }
        if (*(int *)(local_b48 + 0x270) != 0) {
          bVar1 = *(byte *)(local_b30 + (local_b28 & (ulong)local_b38));
          local_bdc = (uint)*(byte *)(local_b48 + 0x275 +
                                     (long)(int)(uint)(*(byte *)(local_b40 + (ulong)bVar1) |
                                                      *(byte *)(local_b40 + 0x100 + (ulong)local_bdd
                                                               )));
          local_bdd = bVar1;
        }
        local_798 = *(long **)(local_b48 + 0x2b8 + (long)(int)local_bdc * 8);
        local_7b8 = local_b28 + 1;
        local_7d0 = local_ca0 + local_b98;
        local_7d8 = *(ulong *)(local_b48 + 0x48);
        local_790 = local_b50;
        local_7a0 = local_b30;
        local_7a8 = local_b38;
        local_7b0 = in_stack_00000010;
        local_7c0 = local_ba8;
        local_7c8 = local_c98;
        local_7e0 = &local_c10;
        local_7e8 = *(long *)(local_b50 + 0x30);
        local_7f0 = *(long *)(local_b50 + 0x38);
        local_7f8 = local_7b8 & (ulong)local_b38;
        local_800 = 0x7e4;
        local_808 = 0x7e4;
        local_810 = local_c90;
        local_c10 = 0;
        local_bf8 = 0;
        for (local_818 = 0; local_818 < (ulong)(long)*(int *)(local_790 + 0x20);
            local_818 = local_818 + 1) {
          local_820 = (ulong)local_7b0[local_818];
          if (((local_7b8 - local_820 < local_7b8) && (local_820 <= local_7c8)) &&
             ((uVar8 = (ulong)local_7a8 & local_7b8 - local_820, local_810 + local_7f8 <= local_7a8
              && ((local_810 + uVar8 <= local_7a8 &&
                  (local_810[local_7a0 + local_7f8] == local_810[local_7a0 + uVar8])))))) {
            puVar13 = (ulong *)(local_7a0 + uVar8);
            local_730 = (ulong *)(local_7a0 + local_7f8);
            local_738 = local_7c0;
            local_728 = puVar13;
LAB_02389d1a:
            if (local_738 < (char *)0x8) {
              while( true ) {
                bVar14 = false;
                if (local_738 != (char *)0x0) {
                  bVar14 = (char)*local_728 == (char)*local_730;
                }
                if (!bVar14) break;
                local_738 = local_738 + -1;
                local_730 = (ulong *)((long)local_730 + 1);
                local_728 = (ulong *)((long)local_728 + 1);
              }
              local_720 = (char *)((long)local_728 - (long)puVar13);
            }
            else {
              uVar8 = *local_730 ^ *local_728;
              local_730 = local_730 + 1;
              if (uVar8 == 0) goto LAB_02389dec;
              iVar7 = 0;
              for (; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
                iVar7 = iVar7 + 1;
              }
              local_720 = (char *)((long)local_728 + (((ulong)(long)iVar7 >> 3) - (long)puVar13));
            }
            if ((((char *)0x2 < local_720) || ((local_720 == (char *)0x2 && (local_818 < 2)))) &&
               (local_838 = (long)local_720 * 0x87 + 0x78f, local_808 < local_838)) {
              if (local_818 != 0) {
                local_838 = local_838 -
                            ((long)(int)(0x1ca10 >> ((byte)local_818 & 0xe) & 0xe) + 0x27);
              }
              if (local_808 < local_838) {
                local_808 = local_838;
                local_810 = local_720;
                *local_7e0 = (ulong)local_720;
                local_7e0[1] = local_820;
                local_7e0[2] = local_808;
              }
            }
          }
        }
        local_840 = (ulong)(*(long *)(local_7a0 + local_7f8) * *(long *)(local_790 + 0x10)) >> 0x31;
        local_848 = local_7f0 + (local_840 << ((byte)*(undefined4 *)(local_790 + 0x1c) & 0x3f)) * 4;
        if (*(ulong *)(local_790 + 8) < (ulong)*(ushort *)(local_7e8 + local_840 * 2)) {
          local_cb0 = (ulong)*(ushort *)(local_7e8 + local_840 * 2) - *(long *)(local_790 + 8);
        }
        else {
          local_cb0 = 0;
        }
        local_850 = local_cb0;
        local_854 = *(int *)(local_7a0 + local_7f8);
        local_860 = local_7c0 + -4;
        local_818 = (ulong)*(ushort *)(local_7e8 + local_840 * 2);
        while (local_850 < local_818) {
          local_818 = local_818 - 1;
          uVar8 = (ulong)*(uint *)(local_848 + (local_818 & *(uint *)(local_790 + 0x18)) * 4);
          local_878 = local_7b8 - uVar8;
          if (local_7c8 < local_878) break;
          uVar8 = (ulong)local_7a8 & uVar8;
          if ((((local_810 + local_7f8 <= local_7a8) && (local_810 + uVar8 <= local_7a8)) &&
              (local_810[local_7a0 + local_7f8] == local_810[local_7a0 + uVar8])) &&
             (local_854 == *(int *)(local_7a0 + uVar8))) {
            puVar13 = (ulong *)(local_7a0 + uVar8 + 4);
            local_768 = (ulong *)(local_7a0 + local_7f8 + 4);
            local_770 = local_860;
            local_760 = puVar13;
LAB_0238a327:
            if (local_770 < (char *)0x8) {
              while( true ) {
                bVar14 = false;
                if (local_770 != (char *)0x0) {
                  bVar14 = (char)*local_760 == (char)*local_768;
                }
                if (!bVar14) break;
                local_770 = local_770 + -1;
                local_768 = (ulong *)((long)local_768 + 1);
                local_760 = (ulong *)((long)local_760 + 1);
              }
              local_758 = (char *)((long)local_760 - (long)puVar13);
            }
            else {
              uVar8 = *local_768 ^ *local_760;
              local_768 = local_768 + 1;
              if (uVar8 == 0) goto LAB_0238a3f9;
              iVar7 = 0;
              for (; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
                iVar7 = iVar7 + 1;
              }
              local_758 = (char *)((long)local_760 + (((ulong)(long)iVar7 >> 3) - (long)puVar13));
            }
            local_758 = local_758 + 4;
            iVar7 = 0x1f;
            if ((uint)local_878 != 0) {
              for (; (uint)local_878 >> iVar7 == 0; iVar7 = iVar7 + -1) {
              }
            }
            uVar8 = ((long)local_758 * 0x87 + 0x780) - (ulong)(uint)(iVar7 * 0x1e);
            if (local_808 < uVar8) {
              local_810 = local_758;
              local_808 = uVar8;
              *local_7e0 = (ulong)local_758;
              local_7e0[1] = local_878;
              local_7e0[2] = local_808;
            }
          }
        }
        *(int *)(local_848 +
                (ulong)((uint)*(ushort *)(local_7e8 + local_840 * 2) & *(uint *)(local_790 + 0x18))
                * 4) = (int)local_7b8;
        *(short *)(local_7e8 + local_840 * 2) = *(short *)(local_7e8 + local_840 * 2) + 1;
        if (local_800 == local_7e0[2]) {
          local_6b0 = *(long *)(local_790 + 0x28);
          local_6b8 = (ulong *)(local_7a0 + local_7f8);
          local_6a8 = local_798;
          local_6c0 = local_7c0;
          local_6c8 = local_7d0;
          local_6d0 = local_7d8;
          local_6d8 = local_7e0;
          local_6dc = 0;
          if (*(ulong *)(local_6b0 + 0x28) >> 7 <= *(ulong *)(local_6b0 + 0x30)) {
            local_6e8 = (ulong)(((uint)((int)*local_6b8 * 0x1e35a7bd) >> 0x12) << 1);
            local_6f0 = 0;
            while( true ) {
              uVar12 = 2;
              if (local_6dc != 0) {
                uVar12 = 1;
              }
              if (uVar12 <= local_6f0) break;
              *(long *)(local_6b0 + 0x28) = *(long *)(local_6b0 + 0x28) + 1;
              if (*(char *)(local_6a8[4] + local_6e8) != '\0') {
                local_5b8 = (char *)(ulong)*(byte *)(local_6a8[4] + local_6e8);
                uVar8 = (ulong)*(ushort *)(local_6a8[3] + local_6e8 * 2);
                local_5e8 = local_6d8;
                if (local_6c0 < local_5b8) {
                  bVar14 = false;
                }
                else {
                  local_580 = (ulong *)(*(long *)(*local_6a8 + 0xa8) +
                                       (ulong)*(uint *)(*local_6a8 + 0x20 + (long)local_5b8 * 4) +
                                       (long)local_5b8 * uVar8);
                  local_578 = local_6b8;
                  local_588 = local_5b8;
LAB_0238a8ce:
                  if (local_588 < (char *)0x8) {
                    while( true ) {
                      bVar14 = false;
                      if (local_588 != (char *)0x0) {
                        bVar14 = (char)*local_578 == (char)*local_580;
                      }
                      if (!bVar14) break;
                      local_588 = local_588 + -1;
                      local_580 = (ulong *)((long)local_580 + 1);
                      local_578 = (ulong *)((long)local_578 + 1);
                    }
                    local_570 = (char *)((long)local_578 - (long)local_6b8);
                  }
                  else {
                    uVar9 = *local_580 ^ *local_578;
                    local_580 = local_580 + 1;
                    if (uVar9 == 0) goto LAB_0238a9a0;
                    iVar7 = 0;
                    for (; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
                      iVar7 = iVar7 + 1;
                    }
                    local_570 = (char *)((long)local_578 +
                                        (((ulong)(long)iVar7 >> 3) - (long)local_6b8));
                  }
                  local_5f8 = (int)local_570;
                  if ((local_5b8 < local_570 + *(uint *)((long)local_6a8 + 0xc)) &&
                     (local_570 != (char *)0x0)) {
                    local_600 = local_6c8 + 1 + uVar8 +
                                (((long)local_5b8 - (long)local_570) * 4 +
                                 ((ulong)local_6a8[2] >>
                                  ((char)((long)local_5b8 - (long)local_570) * '\x06' & 0x3fU) &
                                 0x3f) << (local_5b8[*local_6a8] & 0x3fU));
                    if (local_6d0 < local_600) {
                      bVar14 = false;
                    }
                    else {
                      iVar7 = 0x1f;
                      if ((uint)local_600 != 0) {
                        for (; (uint)local_600 >> iVar7 == 0; iVar7 = iVar7 + -1) {
                        }
                      }
                      local_608 = ((long)local_570 * 0x87 + 0x780) - (ulong)(uint)(iVar7 * 0x1e);
                      if (local_608 < local_6d8[2]) {
                        bVar14 = false;
                      }
                      else {
                        *local_6d8 = (ulong)local_570;
                        *(int *)(local_5e8 + 3) = (int)local_5b8 - local_5f8;
                        local_5e8[1] = local_600;
                        local_5e8[2] = local_608;
                        bVar14 = true;
                      }
                    }
                  }
                  else {
                    bVar14 = false;
                  }
                }
                if (bVar14) {
                  *(long *)(local_6b0 + 0x30) = *(long *)(local_6b0 + 0x30) + 1;
                }
              }
              local_6f0 = local_6f0 + 1;
              local_6e8 = local_6e8 + 1;
            }
          }
        }
        uVar8 = local_b28;
        uVar12 = (uint)local_bc0;
        if (local_c00 < local_bc8 + 0xaf) goto LAB_0238ad63;
        uVar8 = local_b28 + 1;
        local_b70 = local_b70 + 1;
        local_bd8 = local_c10;
        local_bd0 = local_c08;
        local_bc8 = local_c00;
        local_bc0 = (ulong)local_bf8;
        local_be4 = local_be4 + 1;
        uVar12 = local_bf8;
        if ((3 < local_be4) || (uVar9 = local_b28 + 9, local_b28 = uVar8, local_b78 <= uVar9))
        goto LAB_0238ad63;
      } while( true );
    }
    local_b70 = local_b70 + 1;
    uVar8 = local_b28 + 1;
    if (local_b90 < uVar8) {
      if (local_b90 + local_b88 * 4 < uVar8) {
        uVar9 = local_b28 + 0x11;
        local_d00 = local_b78 - 7;
        local_b28 = uVar8;
        if (uVar9 < local_d00) {
          local_d00 = uVar9;
        }
        for (; uVar8 = local_b28, local_b28 < local_d00; local_b28 = local_b28 + 4) {
          lVar10 = *(long *)(local_b50 + 0x30);
          lVar4 = *(long *)(local_b50 + 0x38);
          uVar8 = (ulong)(*(long *)(local_b30 + (local_b28 & (ulong)local_b38)) *
                         *(long *)(local_b50 + 0x10)) >> 0x31;
          uVar2 = *(ushort *)(lVar10 + uVar8 * 2);
          uVar12 = *(uint *)(local_b50 + 0x18);
          uVar3 = *(undefined4 *)(local_b50 + 0x1c);
          *(short *)(lVar10 + uVar8 * 2) = *(short *)(lVar10 + uVar8 * 2) + 1;
          *(int *)(lVar4 + ((ulong)(uVar2 & uVar12) + (uVar8 << ((byte)uVar3 & 0x3f))) * 4) =
               (int)local_b28;
          local_b70 = local_b70 + 4;
        }
      }
      else {
        uVar9 = local_b28 + 9;
        local_d10 = local_b78 - 7;
        local_b28 = uVar8;
        if (uVar9 < local_d10) {
          local_d10 = uVar9;
        }
        for (; uVar8 = local_b28, local_b28 < local_d10; local_b28 = local_b28 + 2) {
          lVar10 = *(long *)(local_b50 + 0x30);
          lVar4 = *(long *)(local_b50 + 0x38);
          uVar8 = (ulong)(*(long *)(local_b30 + (local_b28 & (ulong)local_b38)) *
                         *(long *)(local_b50 + 0x10)) >> 0x31;
          uVar2 = *(ushort *)(lVar10 + uVar8 * 2);
          uVar12 = *(uint *)(local_b50 + 0x18);
          uVar3 = *(undefined4 *)(local_b50 + 0x1c);
          *(short *)(lVar10 + uVar8 * 2) = *(short *)(lVar10 + uVar8 * 2) + 1;
          *(int *)(lVar4 + ((ulong)(uVar2 & uVar12) + (uVar8 << ((byte)uVar3 & 0x3f))) * 4) =
               (int)local_b28;
          local_b70 = local_b70 + 2;
        }
      }
    }
  } while( true );
LAB_0238895c:
  local_3d0 = local_3d0 + 1;
  local_3e0 = local_3e0 + -8;
  goto LAB_0238888a;
LAB_02388f69:
  local_408 = local_408 + 1;
  local_418 = local_418 + -8;
  goto LAB_02388e97;
LAB_02389510:
  local_220 = local_220 + 1;
  local_230 = local_230 + -8;
  goto LAB_0238943e;
LAB_02389dec:
  local_728 = local_728 + 1;
  local_738 = local_738 + -8;
  goto LAB_02389d1a;
LAB_0238a3f9:
  local_760 = local_760 + 1;
  local_770 = local_770 + -8;
  goto LAB_0238a327;
LAB_0238a9a0:
  local_578 = local_578 + 1;
  local_588 = local_588 + -8;
  goto LAB_0238a8ce;
LAB_0238ad63:
  local_bc0._0_4_ = uVar12;
  local_b28 = uVar8;
  local_b90 = local_b28 + local_bd8 * 2 + local_b88;
  local_cc0 = local_b28 + local_b60;
  if (local_b58 <= local_cc0) {
    local_cc0 = local_b58;
  }
  if (local_bd0 <= local_cc0 + local_b98) {
    uVar8 = (local_bd0 + 3) - (long)*in_stack_00000010;
    uVar9 = (local_bd0 + 3) - (long)in_stack_00000010[1];
    if (local_bd0 == (long)*in_stack_00000010) {
      local_a40 = 0;
      goto LAB_0238afc2;
    }
    if (local_bd0 == (long)in_stack_00000010[1]) {
      local_a40 = 1;
      goto LAB_0238afc2;
    }
    if (uVar8 < 7) {
      local_a40 = (ulong)(int)(0x9750468 >> ((byte)((uVar8 & 0x3fffffff) << 2) & 0x1f) & 0xf);
      goto LAB_0238afc2;
    }
    if (uVar9 < 7) {
      local_a40 = (ulong)(int)(0xfdb1ace >> ((byte)((uVar9 & 0x3fffffff) << 2) & 0x1f) & 0xf);
      goto LAB_0238afc2;
    }
    if (local_bd0 == (long)in_stack_00000010[2]) {
      local_a40 = 2;
      goto LAB_0238afc2;
    }
    if (local_bd0 == (long)in_stack_00000010[3]) {
      local_a40 = 3;
      goto LAB_0238afc2;
    }
  }
  local_a40 = local_bd0 + 0xf;
LAB_0238afc2:
  if ((local_bd0 <= local_cc0 + local_b98) && (local_a40 != 0)) {
    in_stack_00000010[3] = in_stack_00000010[2];
    in_stack_00000010[2] = in_stack_00000010[1];
    in_stack_00000010[1] = *in_stack_00000010;
    *in_stack_00000010 = (int)local_bd0;
    iVar7 = *(int *)(local_b50 + 0x20);
    if (4 < iVar7) {
      iVar6 = *in_stack_00000010;
      in_stack_00000010[4] = iVar6 + -1;
      in_stack_00000010[5] = iVar6 + 1;
      in_stack_00000010[6] = iVar6 + -2;
      in_stack_00000010[7] = iVar6 + 2;
      in_stack_00000010[8] = iVar6 + -3;
      in_stack_00000010[9] = iVar6 + 3;
      if (10 < iVar7) {
        iVar7 = in_stack_00000010[1];
        in_stack_00000010[10] = iVar7 + -1;
        in_stack_00000010[0xb] = iVar7 + 1;
        in_stack_00000010[0xc] = iVar7 + -2;
        in_stack_00000010[0xd] = iVar7 + 2;
        in_stack_00000010[0xe] = iVar7 + -3;
        in_stack_00000010[0xf] = iVar7 + 3;
      }
    }
  }
  iVar7 = (int)local_b70;
  *in_stack_00000020 = iVar7;
  in_stack_00000020[1] = (uint)local_bd8 | (uint)local_bc0 << 0x19;
  uVar12 = *(uint *)(local_b48 + 0x3c);
  if (local_a40 < (ulong)uVar12 + 0x10) {
    *(ushort *)((long)in_stack_00000020 + 0xe) = (ushort)local_a40;
    in_stack_00000020[2] = 0;
  }
  else {
    bVar1 = (byte)*(uint *)(local_b48 + 0x38);
    uVar8 = (1L << (bVar1 + 2 & 0x3f)) + ((local_a40 - 0x10) - (ulong)uVar12);
    iVar6 = 0x1f;
    if ((uint)uVar8 != 0) {
      for (; (uint)uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    bVar11 = (byte)(iVar6 - 1U);
    uVar9 = uVar8 >> (bVar11 & 0x3f) & 1;
    lVar10 = (ulong)(iVar6 - 1U) - (ulong)*(uint *)(local_b48 + 0x38);
    *(ushort *)((long)in_stack_00000020 + 0xe) =
         (short)lVar10 * 0x400 |
         (short)uVar12 + 0x10 + (short)((lVar10 + -1) * 2 + uVar9 << (bVar1 & 0x3f)) +
         ((ushort)uVar8 & (short)(1 << (bVar1 & 0x1f)) - 1U);
    in_stack_00000020[2] = (int)(uVar8 - (uVar9 + 2 << (bVar11 & 0x3f)) >> (bVar1 & 0x3f));
  }
  iVar6 = (uint)local_bd8 + (uint)local_bc0;
  uVar8 = (ulong)iVar6;
  if (local_b70 < 6) {
    local_92a = (ushort)local_b70;
  }
  else if (local_b70 < 0x82) {
    iVar5 = 0x1f;
    if (iVar7 - 2U != 0) {
      for (; iVar7 - 2U >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    local_92a = (short)(iVar5 + -1) * 2 + (short)(local_b70 - 2 >> ((byte)(iVar5 + -1) & 0x3f)) + 2;
  }
  else if (local_b70 < 0x842) {
    iVar5 = 0x1f;
    if (iVar7 - 0x42U != 0) {
      for (; iVar7 - 0x42U >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    local_92a = (short)iVar5 + 10;
  }
  else if (local_b70 < 0x1842) {
    local_92a = 0x15;
  }
  else if (local_b70 < 0x5842) {
    local_92a = 0x16;
  }
  else {
    local_92a = 0x17;
  }
  if (uVar8 < 10) {
    local_902 = (short)iVar6 - 2;
  }
  else if (uVar8 < 0x86) {
    iVar7 = 0x1f;
    if (iVar6 - 6U != 0) {
      for (; iVar6 - 6U >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    local_902 = (short)(iVar7 + -1) * 2 + (short)(uVar8 - 6 >> ((byte)(iVar7 + -1) & 0x3f)) + 4;
  }
  else if (uVar8 < 0x846) {
    iVar7 = 0x1f;
    if (iVar6 - 0x46U != 0) {
      for (; iVar6 - 0x46U >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    local_902 = (short)iVar7 + 0xc;
  }
  else {
    local_902 = 0x17;
  }
  local_8da = local_902 & 7 | (local_92a & 7) << 3;
  if ((((*(ushort *)((long)in_stack_00000020 + 0xe) & 0x3ff) == 0) && (local_92a < 8)) &&
     (local_902 < 0x10)) {
    if (7 < local_902) {
      local_8da = local_8da | 0x40;
    }
  }
  else {
    iVar7 = ((int)(uint)local_902 >> 3) + ((int)(uint)local_92a >> 3) * 3;
    local_8da = (short)iVar7 * 0x40 + 0x40 +
                ((ushort)(0x520d40 >> ((char)iVar7 * '\x02' & 0x1fU)) & 0xc0) | local_8da;
  }
  *(ushort *)(in_stack_00000020 + 3) = local_8da;
  *in_stack_00000030 = local_b70 + *in_stack_00000030;
  local_b70 = 0;
  local_c20 = local_b28 + 2;
  local_cd8 = local_b28 + local_bd8;
  if (local_b80 <= local_cd8) {
    local_cd8 = local_b80;
  }
  if (local_bd0 < local_bd8 >> 2) {
    local_ce8 = local_b28 + local_bd8 + local_bd0 * -4;
    if (local_ce8 < local_c20) {
      local_ce8 = local_c20;
    }
    if (local_cd8 < local_ce8) {
      local_cf0 = local_cd8;
    }
    else {
      local_cf0 = local_ce8;
    }
    local_c20 = local_cf0;
  }
  for (local_1d8 = local_c20; local_1d8 < local_cd8; local_1d8 = local_1d8 + 1) {
    lVar10 = *(long *)(local_b50 + 0x30);
    lVar4 = *(long *)(local_b50 + 0x38);
    uVar8 = (ulong)(*(long *)(local_b30 + (local_1d8 & (ulong)local_b38)) *
                   *(long *)(local_b50 + 0x10)) >> 0x31;
    uVar2 = *(ushort *)(lVar10 + uVar8 * 2);
    uVar12 = *(uint *)(local_b50 + 0x18);
    uVar3 = *(undefined4 *)(local_b50 + 0x1c);
    *(short *)(lVar10 + uVar8 * 2) = *(short *)(lVar10 + uVar8 * 2) + 1;
    *(int *)(lVar4 + ((ulong)(uVar2 & uVar12) + (uVar8 << ((byte)uVar3 & 0x3f))) * 4) =
         (int)local_1d8;
  }
  in_stack_00000020 = in_stack_00000020 + 4;
  uVar8 = local_bd8 + local_b28;
  goto LAB_0238839e;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}